

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O2

void __thiscall
MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>::ConcreteMachine
          (ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false> *this,Target *target,
          ROMFetcher *rom_fetcher)

{
  BinaryTapePlayer *this_00;
  MemorySlotChangeHandler *pMVar1;
  MemorySlotHandler *pMVar2;
  undefined8 uVar3;
  bool bVar4;
  iterator iVar5;
  MemorySlot *pMVar6;
  undefined4 *puVar7;
  byte bVar8;
  _Base_ptr *this_01;
  byte bVar9;
  byte bVar10;
  initializer_list<double> __l;
  Name regional_bios_name;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Name bios_name;
  AYPortHandler *local_f8;
  undefined1 local_f0 [40];
  Request request;
  Request bios_request;
  string machine_name;
  
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__Machine_00586128;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0057d638;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_0057cd58;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_0057d600;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&PTR___cxa_pure_virtual_0057d680;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &roms._M_t._M_impl.super__Rb_tree_header._M_header;
  roms._M_t._M_impl._0_16_ = (undefined1  [16])0x0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  roms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&roms);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)&roms);
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_005868e0;
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_005869a8;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_005869f0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_00586a08;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_00586a40;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_00586a58;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_00586a88;
  (this->super_JoystickMachine)._vptr_JoystickMachine = (_func_int **)&DAT_00586ac8;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_00586ae0;
  (this->super_Observer)._vptr_Observer = (_func_int **)&DAT_00586b00;
  (this->super_Source)._vptr_Source = (_func_int **)&DAT_00586b18;
  (this->super_MemorySlotChangeHandler)._vptr_MemorySlotChangeHandler = (_func_int **)&DAT_00586b30;
  CPU::Z80::
  Processor<MSX::ConcreteMachine<(Analyser::Static::MSX::Target::Model)0,_false>,_false,_false>::
  Processor(&this->z80_,this);
  JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::JustInTimeActor<>
            (&this->vdp_);
  (this->i8255_).control_ = '\0';
  (this->i8255_).outputs_[0] = '\0';
  (this->i8255_).outputs_[1] = '\0';
  (this->i8255_).outputs_[2] = '\0';
  (this->i8255_).port_handler_ = &this->i8255_port_handler_;
  this_00 = &this->tape_player_;
  Storage::Tape::BinaryTapePlayer::BinaryTapePlayer(this_00,0x6d3d32);
  this->tape_player_is_sleeping_ = false;
  this->allow_fast_tape_ = false;
  this->use_fast_tape_ = false;
  (this->i8255_port_handler_).machine_ = this;
  (this->i8255_port_handler_).audio_toggle_ = &(this->speaker_).audio_toggle;
  (this->i8255_port_handler_).tape_player_ = this_00;
  (this->i8255_port_handler_).activity_observer_ = (Observer *)0x0;
  Speaker<false>::Speaker(&this->speaker_);
  local_f8 = &this->ay_port_handler_;
  AYPortHandler::AYPortHandler(local_f8,this_00);
  pMVar1 = &this->super_MemorySlotChangeHandler;
  this->primary_slots_ = '\0';
  this->ram_mapper_[0] = '\0';
  this->ram_mapper_[1] = '\0';
  this->ram_mapper_[2] = '\0';
  this->ram_mapper_[3] = '\0';
  HandledSlot::PrimarySlot(this->memory_slots_,pMVar1);
  HandledSlot::PrimarySlot(this->memory_slots_ + 1,pMVar1);
  HandledSlot::PrimarySlot(this->memory_slots_ + 2,pMVar1);
  HandledSlot::PrimarySlot(this->memory_slots_ + 3,pMVar1);
  this->selected_key_line_ = 0;
  this->final_slot_ = (HandledSlot *)0x0;
  this->time_since_ay_update_ = (WrappedInt<HalfCycles>)0x0;
  (this->input_text_)._M_dataplus._M_p = (pointer)&(this->input_text_).field_2;
  (this->input_text_)._M_string_length = 0;
  (this->input_text_).field_2._M_local_buf[0] = '\0';
  (this->keyboard_mapper_).super_KeyboardMapper._vptr_KeyboardMapper =
       (_func_int **)&PTR_mapped_key_for_key_00585d98;
  this->pc_zero_accesses_ = 0;
  this->performed_unmapped_access_ = false;
  Ricoh::RP5C01::RP5C01::RP5C01(&this->clock_,(HalfCycles)0x369e99);
  this->next_clock_register_ = 0;
  (this->super_TimedMachine).clock_rate_ = 3579545.0;
  this->key_states_[0] = 0xff;
  this->key_states_[1] = 0xff;
  this->key_states_[2] = 0xff;
  this->key_states_[3] = 0xff;
  this->key_states_[4] = 0xff;
  this->key_states_[5] = 0xff;
  this->key_states_[6] = 0xff;
  this->key_states_[7] = 0xff;
  this->key_states_[8] = 0xff;
  this->key_states_[9] = 0xff;
  this->key_states_[10] = 0xff;
  this->key_states_[0xb] = 0xff;
  this->key_states_[0xc] = 0xff;
  this->key_states_[0xd] = 0xff;
  this->key_states_[0xe] = 0xff;
  this->key_states_[0xf] = 0xff;
  GI::AY38910::AY38910SampleSource<false>::set_port_handler
            (&(this->speaker_).ay.super_AY38910SampleSource<false>,&local_f8->super_PortHandler);
  Outputs::Speaker::
  LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC>_>,_false>
  ::set_input_rate(&(this->speaker_).speaker.
                    super_LowpassBase<Outputs::Speaker::PullLowpass<Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC>_>,_false>
                   ,1789772.5);
  (this->tape_player_).super_TapePlayer.super_Source.observer_ = &this->super_Observer;
  ClockingHint::Source::update_clocking_observer
            (&(this->tape_player_).super_TapePlayer.super_Source);
  bios_request.node.type = Any;
  bios_request.node.name = 0x3fe00000;
  bios_request.node.is_optional = false;
  bios_request.node._9_7_ = 0x3fb99999a00000;
  bios_request.node.children.
  super__Vector_base<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3fd99999a0000000;
  __l._M_len = 3;
  __l._M_array = (iterator)&bios_request;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&roms,__l,(allocator_type *)&request);
  Outputs::Speaker::CompoundSource<GI::AY38910::AY38910<false>,_Audio::Toggle,_Konami::SCC>::
  set_relative_volumes(&(this->speaker_).mixer,(vector<double,_std::allocator<double>_> *)&roms);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&roms);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&machine_name,"MSX",(allocator<char> *)&roms);
  bios_name = MSXGenericBIOS;
  ROM::Request::Request(&bios_request,MSXGenericBIOS,false);
  if (target->region == USA) {
    regional_bios_name = MSXAmericanBIOS;
    JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
              ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)&roms
              );
    TI::TMS::TMS9918<(TI::TMS::Personality)0>::set_tv_standard
              ((TMS9918<(TI::TMS::Personality)0> *)
               roms._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,NTSC);
    std::
    unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)&roms);
    bVar9 = 0x10;
    bVar10 = 1;
  }
  else {
    if (target->region == Europe) {
      regional_bios_name = MSXEuropeanBIOS;
      JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
                ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)
                 &roms);
      TI::TMS::TMS9918<(TI::TMS::Personality)0>::set_tv_standard
                ((TMS9918<(TI::TMS::Personality)0> *)
                 roms._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,PAL);
      std::
      unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
      ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                     *)&roms);
      bVar8 = 0x80;
      bVar9 = 0x20;
      bVar10 = 1;
      goto LAB_00310c3c;
    }
    regional_bios_name = MSXJapaneseBIOS;
    JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::operator->
              ((JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1> *)&roms
              );
    TI::TMS::TMS9918<(TI::TMS::Personality)0>::set_tv_standard
              ((TMS9918<(TI::TMS::Personality)0> *)
               roms._M_t._M_impl.super__Rb_tree_header._M_header._0_8_,NTSC);
    std::
    unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
    ::~unique_ptr((unique_ptr<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_JustInTimeActor<TI::TMS::TMS9918<(TI::TMS::Personality)0>,_HalfCycles,_1,_1>::SequencePointAwareDeleter>
                   *)&roms);
    bVar10 = 0;
    bVar9 = 0;
  }
  bVar8 = 0;
LAB_00310c3c:
  ROM::Request::Request(&request,regional_bios_name,false);
  ROM::Request::operator||((Request *)&roms,&bios_request,&request);
  ROM::Request::Node::operator=(&bios_request.node,(Node *)&roms);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
             &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&request.node.children);
  ROM::Request::Node::Node(&request.node,&bios_request.node);
  if (target->has_disk_drive == true) {
    ROM::Request::Request((Request *)local_f0,MSXDOS,false);
    ROM::Request::operator&&((Request *)&roms,&request,(Request *)local_f0);
    ROM::Request::Node::operator=(&request.node,(Node *)&roms);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
               &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)(local_f0 + 0x10))
    ;
  }
  if (target->has_msx_music == true) {
    ROM::Request::Request((Request *)local_f0,MSXMusic,false);
    ROM::Request::operator&&((Request *)&roms,&request,(Request *)local_f0);
    ROM::Request::Node::operator=(&request.node,(Node *)&roms);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)
               &roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              ((vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_> *)(local_f0 + 0x10))
    ;
  }
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()(&roms,rom_fetcher,&request);
  bVar4 = ROM::Request::validate(&request,&roms);
  if (bVar4) {
    iVar5 = std::
            _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            ::find(&roms._M_t,&regional_bios_name);
    if ((_Rb_tree_header *)iVar5._M_node == &roms._M_t._M_impl.super__Rb_tree_header) {
      iVar5 = std::
              _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::find(&roms._M_t,&bios_name);
      this_01 = &iVar5._M_node[1]._M_parent;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01,0x8000);
      *(byte *)((long)&(*this_01)[1]._M_parent + 3) = bVar9 | bVar10 | bVar8;
      *(undefined1 *)((long)&(*this_01)[1]._M_parent + 4) = 1;
      pMVar6 = bios_slot(this);
      MemorySlot::set_source
                (pMVar6,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_01);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &iVar5._M_node[1]._M_parent,0x8000);
      pMVar6 = bios_slot(this);
      MemorySlot::set_source
                (pMVar6,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &iVar5._M_node[1]._M_parent);
    }
    pMVar6 = bios_slot(this);
    MemorySlot::map<(MSX::MemorySlot::AccessType)0>(pMVar6,0,0,0x8000);
    pMVar6 = ram_slot(this);
    MemorySlot::resize_source(pMVar6,0x10000);
    pMVar6 = ram_slot(this);
    MemorySlot::map<(MSX::MemorySlot::AccessType)1>(pMVar6,0,0,0x10000);
    if (target->has_disk_drive == true) {
      disk_slot(this);
      std::make_unique<MSX::DiskROM,MSX::MemorySlot&>((MemorySlot *)local_f0);
      uVar3 = local_f0._0_8_;
      local_f0._0_8_ = (long *)0x0;
      pMVar2 = this->memory_slots_[2].handler._M_t.
               super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>
               ._M_t.
               super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
               .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl;
      this->memory_slots_[2].handler._M_t.
      super___uniq_ptr_impl<MSX::MemorySlotHandler,_std::default_delete<MSX::MemorySlotHandler>_>.
      _M_t.
      super__Tuple_impl<0UL,_MSX::MemorySlotHandler_*,_std::default_delete<MSX::MemorySlotHandler>_>
      .super__Head_base<0UL,_MSX::MemorySlotHandler_*,_false>._M_head_impl =
           (MemorySlotHandler *)uVar3;
      if (pMVar2 != (MemorySlotHandler *)0x0) {
        (*pMVar2->_vptr_MemorySlotHandler[1])();
        if ((long *)local_f0._0_8_ != (long *)0x0) {
          (**(code **)(*(long *)local_f0._0_8_ + 8))();
        }
      }
      local_f0._0_4_ = 0x44;
      iVar5 = std::
              _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::find(&roms._M_t,(key_type *)local_f0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &iVar5._M_node[1]._M_parent,0x4000);
      pMVar6 = disk_slot(this);
      MemorySlot::set_source
                (pMVar6,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &iVar5._M_node[1]._M_parent);
      pMVar6 = disk_slot(this);
      MemorySlot::map<(MSX::MemorySlot::AccessType)0>(pMVar6,0,0x4000,0x2000);
      pMVar6 = disk_slot(this);
      MemorySlot::map_handler(pMVar6,0x6000,0x2000);
    }
    if (target->has_msx_music == true) {
      local_f0._0_4_ = 0x47;
      iVar5 = std::
              _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::find(&roms._M_t,(key_type *)local_f0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &iVar5._M_node[1]._M_parent,0x10000);
      pMVar6 = msx_music_slot(this);
      MemorySlot::set_source
                (pMVar6,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        &iVar5._M_node[1]._M_parent);
      pMVar6 = msx_music_slot(this);
      MemorySlot::map<(MSX::MemorySlot::AccessType)0>(pMVar6,0,0,0x10000);
    }
    insert_media(this,&(target->super_Target).media);
    if ((target->loading_command)._M_string_length != 0) {
      type_string(this,&target->loading_command);
    }
    this->primary_slots_ = '\0';
    update_paging(this);
    std::
    _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::~_Rb_tree(&roms._M_t);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&request.node.children);
    std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
              (&bios_request.node.children);
    std::__cxx11::string::~string((string *)&machine_name);
    return;
  }
  puVar7 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar7 = 0;
  __cxa_throw(puVar7,&ROMMachine::Error::typeinfo,0);
}

Assistant:

ConcreteMachine(const Target &target, const ROMMachine::ROMFetcher &rom_fetcher):
			z80_(*this),
			i8255_(i8255_port_handler_),
			tape_player_(3579545 * 2),
			i8255_port_handler_(*this, speaker_.audio_toggle, tape_player_),
			ay_port_handler_(tape_player_),
			memory_slots_{{*this}, {*this}, {*this}, {*this}},
			clock_(ClockRate) {
			set_clock_rate(ClockRate);
			clear_all_keys();

			speaker_.ay.set_port_handler(&ay_port_handler_);
			speaker_.speaker.set_input_rate(3579545.0f / 2.0f);
			tape_player_.set_clocking_hint_observer(this);

			// Set the AY to 50% of available volume, the toggle to 10% and leave 40% for an SCC.
			// If there is an OPLL, give it equal volume to the AY and expect some clipping.
			if constexpr (has_opll) {
				speaker_.mixer.set_relative_volumes({0.5f, 0.1f, 0.4f, 0.5f});
			} else {
				speaker_.mixer.set_relative_volumes({0.5f, 0.1f, 0.4f});
			}

			// Install the proper TV standard and select an ideal BIOS name.
			const std::string machine_name = "MSX";
			constexpr ROM::Name bios_name = model == Target::Model::MSX1 ? ROM::Name::MSXGenericBIOS : ROM::Name::MSX2GenericBIOS;

			ROM::Request bios_request = ROM::Request(bios_name);
			if constexpr (model == Target::Model::MSX2) {
				bios_request = bios_request && ROM::Request(ROM::Name::MSX2Extension);
			}

			bool is_ntsc = true;
			uint8_t character_generator = 1;	/* 0 = Japan, 1 = USA, etc, 2 = USSR */
			uint8_t date_format = 1;			/* 0 = Y/M/D, 1 = M/D/Y, 2 = D/M/Y */
			uint8_t keyboard = 1;				/* 0 = Japan, 1 = USA, 2 = France, 3 = UK, 4 = Germany, 5 = USSR, 6 = Spain */
			[[maybe_unused]] ROM::Name regional_bios_name;

			switch(target.region) {
				default:
				case Target::Region::Japan:
					if constexpr (model == Target::Model::MSX1) {
						regional_bios_name = ROM::Name::MSXJapaneseBIOS;
					}
					vdp_->set_tv_standard(TI::TMS::TVStandard::NTSC);

					is_ntsc = true;
					character_generator = 0;
					date_format = 0;
				break;
				case Target::Region::USA:
					if constexpr (model == Target::Model::MSX1) {
						regional_bios_name = ROM::Name::MSXAmericanBIOS;
					}
					vdp_->set_tv_standard(TI::TMS::TVStandard::NTSC);

					is_ntsc = true;
					character_generator = 1;
					date_format = 1;
				break;
				case Target::Region::Europe:
					if constexpr (model == Target::Model::MSX1) {
						regional_bios_name = ROM::Name::MSXEuropeanBIOS;
					}
					vdp_->set_tv_standard(TI::TMS::TVStandard::PAL);

					is_ntsc = false;
					character_generator = 1;
					date_format = 2;
				break;
			}
			if constexpr (model == Target::Model::MSX1) {
				bios_request = bios_request || ROM::Request(regional_bios_name);
			}

			// Fetch the necessary ROMs; try the region-specific ROM first,
			// but failing that fall back on patching the main one.
			ROM::Request request = bios_request;
			if(target.has_disk_drive) {
				request = request && ROM::Request(ROM::Name::MSXDOS);
			}
			if(target.has_msx_music) {
				request = request && ROM::Request(ROM::Name::MSXMusic);
			}

			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}

			// Figure out which BIOS to use, either a specific one or the generic
			// one appropriately patched.
			bool has_bios = false;
			if constexpr (model == Target::Model::MSX1) {
				const auto regional_bios = roms.find(regional_bios_name);
				if(regional_bios != roms.end()) {
					regional_bios->second.resize(32768);
					bios_slot().set_source(regional_bios->second);
					has_bios = true;
				}
			}
			if(!has_bios) {
				std::vector<uint8_t> &bios = roms.find(bios_name)->second;

				bios.resize(32768);

				// Modify the generic ROM to reflect the selected region, date format, etc.
				bios[0x2b] = uint8_t(
					(is_ntsc ? 0x00 : 0x80) |
					(date_format << 4) |
					character_generator
				);
				bios[0x2c] = keyboard;

				bios_slot().set_source(bios);
			}

			bios_slot().map(0, 0, 32768);

			ram_slot().resize_source(RAMSize);
			ram_slot().template map<MemorySlot::AccessType::ReadWrite>(0, 0, 65536);

			if constexpr (model == Target::Model::MSX2) {
				memory_slots_[3].supports_secondary_paging = true;

				const auto extension = roms.find(ROM::Name::MSX2Extension);
				extension->second.resize(32768);
				extension_rom_slot().set_source(extension->second);
				extension_rom_slot().map(0, 0, 32768);
			}

			// Add a disk cartridge if any disks were supplied.
			if(target.has_disk_drive) {
				disk_primary().handler = std::make_unique<DiskROM>(disk_slot());

				std::vector<uint8_t> &dos = roms.find(ROM::Name::MSXDOS)->second;
				dos.resize(16384);
				disk_slot().set_source(dos);

				disk_slot().map(0, 0x4000, 0x2000);
				disk_slot().map_handler(0x6000, 0x2000);
			}

			// Grab the MSX-MUSIC ROM if applicable.
			if(target.has_msx_music) {
				std::vector<uint8_t> &msx_music = roms.find(ROM::Name::MSXMusic)->second;
				msx_music.resize(65536);
				msx_music_slot().set_source(msx_music);
				msx_music_slot().map(0, 0, 0x10000);
			}

			// Insert the media.
			insert_media(target.media);

			// Type whatever has been requested.
			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
			}

			// Establish default paging.
			page_primary(0);
		}